

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::textureLevelsTest(TestContext *testCtx,Context *context)

{
  GLenum expect;
  int iVar1;
  uint uVar2;
  int ndx;
  long lVar3;
  GLint maxTexSize;
  uint local_1bc;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  undefined8 local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  undefined4 local_18c;
  ios_base local_140 [272];
  
  (*context->_vptr_Context[0x7b])(context,0xd33,&local_1bc);
  if (local_1bc == 0) {
    uVar2 = 0x20;
  }
  else {
    uVar2 = 0x1f;
    if (local_1bc != 0) {
      for (; local_1bc >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  local_1b8 = (undefined1  [8])testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"// GL_MAX_TEXTURE_SIZE is ",0x1a);
  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,local_1bc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,", floor(log2(",0xd);
  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,local_1bc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,")) = ",5);
  iVar1 = 0x1f - uVar2;
  std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,iVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  (*context->_vptr_Context[6])(context,0xde1,1);
  lVar3 = 0;
  (*context->_vptr_Context[0x7e])(context,0xde1,0,0x1907,0x100,0x100);
  (*context->_vptr_Context[0x7e])(context,0xde1,1,0x1907,0x80,0x80);
  (*context->_vptr_Context[9])(context,0x8d40,1);
  local_1b8 = (undefined1  [8])0x100000002;
  pp_Stack_1b0 = (_func_int **)0xffffffff00000000;
  local_1a8 = 0x7fffffff;
  local_1a0 = 0x1d - uVar2;
  local_19c = 0x1e - uVar2;
  local_198 = iVar1;
  local_194 = 0x20 - uVar2;
  local_190 = 0x21 - uVar2;
  local_18c = 1;
  do {
    uVar2 = *(uint *)(local_1b8 + lVar3 * 4);
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,1,(ulong)uVar2);
    expect = 0;
    if (iVar1 < (int)uVar2) {
      expect = 0x501;
    }
    if ((int)uVar2 < 0) {
      expect = 0x501;
    }
    checkError(testCtx,context,expect);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xc);
  return;
}

Assistant:

static void textureLevelsTest (tcu::TestContext& testCtx, sglr::Context& context)
{
	deUint32	tex		= 1;
	deUint32	fbo		= 1;
	GLint		maxTexSize;
	int			log2MaxTexSize;

	context.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
	log2MaxTexSize = deLog2Floor32(maxTexSize);

	testCtx.getLog() << TestLog::Message << "// GL_MAX_TEXTURE_SIZE is " << maxTexSize << ", floor(log2(" << maxTexSize << ")) = " << log2MaxTexSize << TestLog::EndMessage;

	context.bindTexture(GL_TEXTURE_2D, tex);
	context.texImage2D(GL_TEXTURE_2D, 0, GL_RGB, 256, 256);
	context.texImage2D(GL_TEXTURE_2D, 1, GL_RGB, 128, 128);

	context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

	const int levels[] = { 2, 1, 0, -1, 0x7fffffff, 0, log2MaxTexSize-2, log2MaxTexSize-1, log2MaxTexSize, log2MaxTexSize+1, log2MaxTexSize+2, 1 };

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(levels); ndx++)
	{
		context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, levels[ndx]);
		checkError(testCtx, context, levels[ndx] >= 0 && levels[ndx] <= log2MaxTexSize ? GL_NO_ERROR : GL_INVALID_VALUE);
	}
}